

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetGroupObject
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this,
          ResolvedObject *pResolvedObject)

{
  Var aValue;
  ScriptContext *pSVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  ArenaAllocator *alloc;
  IDiagObjectModelDisplay *pIVar7;
  RecyclableObject *this_00;
  Type TVar8;
  
  pResolvedObject->name = L"[WeakSet]";
  pResolvedObject->propId = -1;
  aValue = this->instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = this->scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_007f7eaf;
    *puVar6 = 0;
  }
  bVar4 = TaggedInt::Is(aValue);
  if (bVar4) {
    TVar8 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar8 = TypeIds_Number;
      goto LAB_007f7d88;
    }
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_007f7eaf;
      *puVar6 = 0;
    }
    TVar8 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_007f7eaf:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
LAB_007f7d88:
  pResolvedObject->typeId = TVar8;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  alloc = GetArenaFromContext(this->scriptContext);
  pIVar7 = (IDiagObjectModelDisplay *)new<Memory::ArenaAllocator>(0x20,alloc,0x35916e);
  pSVar1 = this->scriptContext;
  pp_Var2 = (_func_int **)pResolvedObject->name;
  pIVar7->_vptr_IDiagObjectModelDisplay = (_func_int **)&PTR_Name_01381448;
  pIVar7[1]._vptr_IDiagObjectModelDisplay = (_func_int **)pSVar1;
  pIVar7[2]._vptr_IDiagObjectModelDisplay = pp_Var2;
  pIVar7[3]._vptr_IDiagObjectModelDisplay = (_func_int **)this;
  pResolvedObject->objectDisplay = pIVar7;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = Name();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        typedef RecyclableCollectionObjectDisplay<TData> RecyclableDataObjectDisplay;
        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclableDataObjectDisplay, scriptContext, pResolvedObject->name, this);

        return TRUE;
    }